

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int encode_array_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint32_t count,
                      uint32_t size,AMQP_VALUE *items,_Bool use_smallest)

{
  _Bool first_element;
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  ulong uVar4;
  undefined7 in_register_00000089;
  char *pcVar5;
  uchar local_3a;
  uchar local_39;
  uchar local_38;
  uchar local_37;
  uchar local_36;
  uchar local_35;
  uchar local_34;
  uchar local_33;
  uchar local_32;
  uchar local_31;
  
  if ((int)CONCAT71(in_register_00000089,use_smallest) == 0) {
    iVar3 = size + 4;
    local_36 = (uchar)((uint)iVar3 >> 0x18);
    iVar1 = (*encoder_output)(context,&local_36,1);
    if (iVar1 == 0) {
      local_35 = (uchar)((uint)iVar3 >> 0x10);
      iVar1 = (*encoder_output)(context,&local_35,1);
      if (iVar1 == 0) {
        local_3a = (uchar)((uint)iVar3 >> 8);
        iVar1 = (*encoder_output)(context,&local_3a,1);
        if (iVar1 == 0) {
          local_34 = (uchar)iVar3;
          iVar1 = (*encoder_output)(context,&local_34,1);
          if (iVar1 == 0) {
            local_33 = (uchar)(count >> 0x18);
            iVar1 = (*encoder_output)(context,&local_33,1);
            if (iVar1 == 0) {
              local_32 = (uchar)(count >> 0x10);
              iVar1 = (*encoder_output)(context,&local_32,1);
              if (iVar1 == 0) {
                local_39 = (uchar)(count >> 8);
                iVar1 = (*encoder_output)(context,&local_39,1);
                if ((iVar1 == 0) &&
                   (local_31 = (uchar)count, iVar1 = (*encoder_output)(context,&local_31,1),
                   iVar1 == 0)) goto LAB_001491cb;
              }
            }
          }
        }
      }
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x10b9;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x10b9;
    }
    pcVar5 = "Could not encode large array header";
    iVar3 = 0x10b8;
  }
  else {
    local_38 = (char)size + '\x01';
    iVar1 = (*encoder_output)(context,&local_38,1);
    if ((iVar1 != 0) ||
       (local_37 = (uchar)count, iVar1 = (*encoder_output)(context,&local_37,1), iVar1 != 0)) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x10a1;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x10a1;
      }
      pcVar5 = "Could not encode small array header";
      iVar3 = 0x10a0;
      goto LAB_001491b4;
    }
LAB_001491cb:
    first_element = true;
    uVar4 = 0;
    while( true ) {
      if (count == uVar4) {
        return 0;
      }
      iVar1 = amqpvalue_encode_array_item(items[uVar4],first_element,encoder_output,context);
      if (iVar1 != 0) break;
      uVar4 = uVar4 + 1;
      first_element = false;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"encode_array_value",0x10ca,1,"Failed encoding element %u of the array",(int)uVar4)
      ;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x10d3;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x10d3;
    }
    pcVar5 = "Could not encode array";
    iVar3 = 0x10d2;
  }
LAB_001491b4:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"encode_array_value",iVar3,1,pcVar5);
  return iVar1;
}

Assistant:

static int encode_array_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint32_t count, uint32_t size, AMQP_VALUE* items, bool use_smallest)
{
    int result;
    size_t i;

    if (use_smallest)
    {
        size++;

        /* Codes_SRS_AMQPVALUE_01_306: [<encoding name="map8" code="0xE0" category="compound" width="1" label="up to 2^8 - 1 octets of encoded map data"/>] */
        if ((output_byte(encoder_output, context, (size & 0xFF)) != 0) ||
            (output_byte(encoder_output, context, (count & 0xFF)) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode small array header");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        size += 4;

        /* Codes_SRS_AMQPVALUE_01_307: [<encoding name="map32" code="0xF0" category="compound" width="4" label="up to 2^32 - 1 octets of encoded map data"/>] */
        if ((output_byte(encoder_output, context, (size >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (size >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, size & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 24) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 16) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, (count >> 8) & 0xFF) != 0) ||
            (output_byte(encoder_output, context, count & 0xFF) != 0))
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not encode large array header");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    if (result == 0)
    {
        bool first_element = true;

        for (i = 0; i < count; i++)
        {
            if (amqpvalue_encode_array_item(items[i], first_element, encoder_output, context) != 0)
            {
                LogError("Failed encoding element %u of the array", (unsigned int)i);
                break;
            }
            first_element = false;
        }

        if (i < count)
        {
            LogError("Could not encode array");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}